

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>::
BasicBufferCase(BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                *this,Context *context,char *name,char *desc,int bufferSizeMin,int bufferSizeMax,
               int numSamples,int flags)

{
  undefined8 *puVar1;
  deUint64 *pdVar2;
  bool bVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  deUint64 dVar7;
  uint uVar8;
  pointer pUVar9;
  pointer pUVar10;
  uint uVar11;
  _Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
  *__n;
  _Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
  *this_00;
  long lVar12;
  int iVar13;
  float fVar14;
  allocator_type local_39;
  float local_38;
  float local_34;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,NODETYPE_PERFORMANCE,name,desc);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BasicBufferCase_00d16298;
  this->m_dummyProgram = (ShaderProgram *)0x0;
  this->m_dummyProgramPosLoc = -1;
  this->m_bufferID = 0;
  this->m_numSamples = numSamples;
  this->m_bufferSizeMin = bufferSizeMin;
  this->m_bufferSizeMax = bufferSizeMax;
  this->m_allocateLargerBuffer = (bool)((byte)flags & 1);
  this->m_iteration = 0;
  this_00 = (_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
             *)(long)numSamples;
  __n = this_00;
  std::vector<int,_std::allocator<int>_>::vector
            (&this->m_iterationOrder,(size_type)this_00,&local_39);
  if (numSamples < 0) {
    std::__throw_length_error("cannot create std::vector larger than max_size()");
  }
  (this->m_results).
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_results).
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_results).
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pUVar9 = std::
           _Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
           ::_M_allocate(this_00,(size_t)__n);
  (this->m_results).
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pUVar9;
  (this->m_results).
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pUVar9 + (long)this_00;
  pUVar10 = pUVar9;
  if (numSamples != 0) {
    (pUVar9->duration).totalDuration = 0;
    (pUVar9->duration).fitResponseDuration = 0;
    pUVar9->bufferSize = 0;
    pUVar9->allocatedSize = 0;
    *(undefined8 *)&pUVar9->writtenSize = 0;
    if (numSamples == 1) {
      pUVar10 = pUVar9 + 1;
    }
    else {
      lVar12 = 0x20;
      do {
        uVar5 = *(undefined8 *)pUVar9;
        uVar6 = *(undefined8 *)&pUVar9->writtenSize;
        dVar7 = (pUVar9->duration).fitResponseDuration;
        pdVar2 = (deUint64 *)((long)&(pUVar9->duration).totalDuration + lVar12);
        *pdVar2 = (pUVar9->duration).totalDuration;
        pdVar2[1] = dVar7;
        puVar1 = (undefined8 *)((long)&pUVar9->bufferSize + lVar12);
        *puVar1 = uVar5;
        puVar1[1] = uVar6;
        lVar12 = lVar12 + 0x20;
        pUVar10 = pUVar9 + (long)this_00;
      } while ((long)this_00 * 0x20 != lVar12);
    }
  }
  (this->m_results).
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pUVar10;
  this->m_useGL = true;
  this->m_bufferRandomizerTimer = 0;
  generateTwoPassRandomIterationOrder(&this->m_iterationOrder,this->m_numSamples);
  iVar4 = this->m_numSamples;
  if (0 < (long)iVar4) {
    local_34 = (float)bufferSizeMin;
    local_38 = (float)iVar4;
    bVar3 = this->m_allocateLargerBuffer;
    pUVar10 = (this->m_results).
              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar13 = 1;
    lVar12 = 0;
    do {
      fVar14 = floorf(((float)iVar13 / local_38) * (float)(bufferSizeMax - bufferSizeMin) + local_34
                     );
      uVar8 = (int)fVar14 + 0xfU & 0xfffffff0;
      uVar11 = (int)((float)(int)uVar8 * 1.5);
      if (bVar3 == false) {
        uVar11 = uVar8;
      }
      *(uint *)((long)&pUVar10->bufferSize + lVar12) = uVar8;
      *(uint *)((long)&pUVar10->allocatedSize + lVar12) = uVar11 + 0xf & 0xfffffff0;
      *(undefined4 *)((long)&pUVar10->writtenSize + lVar12) = 0xffffffff;
      lVar12 = lVar12 + 0x20;
      iVar13 = iVar13 + 1;
    } while ((long)iVar4 * 0x20 != lVar12);
  }
  return;
}

Assistant:

BasicBufferCase<SampleType>::BasicBufferCase (Context& context, const char* name, const char* desc, int bufferSizeMin, int bufferSizeMax, int numSamples, int flags)
	: TestCase					(context, tcu::NODETYPE_PERFORMANCE, name, desc)
	, m_dummyProgram			(DE_NULL)
	, m_dummyProgramPosLoc		(-1)
	, m_bufferID				(0)
	, m_numSamples				(numSamples)
	, m_bufferSizeMin			(bufferSizeMin)
	, m_bufferSizeMax			(bufferSizeMax)
	, m_allocateLargerBuffer	((flags & FLAG_ALLOCATE_LARGER_BUFFER) != 0)
	, m_iteration				(0)
	, m_iterationOrder			(numSamples)
	, m_results					(numSamples)
	, m_useGL					(true)
	, m_bufferRandomizerTimer	(0)
{
	// "randomize" iteration order. Deterministic, patternless
	generateTwoPassRandomIterationOrder(m_iterationOrder, m_numSamples);

	// choose buffer sizes
	for (int sampleNdx = 0; sampleNdx < m_numSamples; ++sampleNdx)
	{
		const int rawBufferSize			= (int)deFloatFloor((float)bufferSizeMin + (float)(bufferSizeMax - bufferSizeMin) * ((float)(sampleNdx + 1) / (float)m_numSamples));
		const int bufferSize			= deAlign32(rawBufferSize, 16);
		const int allocatedBufferSize	= deAlign32((m_allocateLargerBuffer) ? ((int)((float)bufferSize * 1.5f)) : (bufferSize), 16);

		m_results[sampleNdx].bufferSize		= bufferSize;
		m_results[sampleNdx].allocatedSize	= allocatedBufferSize;
		m_results[sampleNdx].writtenSize	= -1;
	}
}